

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void map_evacuate(void *map_evacuate_void)

{
  long lVar1;
  Character *this;
  World *pWVar2;
  pointer ppCVar3;
  int iVar4;
  int iVar5;
  mapped_type *pmVar6;
  long *plVar7;
  pointer ppCVar8;
  long *plVar9;
  allocator<char> local_be;
  allocator<char> local_bd;
  int local_bc;
  long *local_b8;
  int local_b0;
  int local_ac;
  vector<Character_*,_std::allocator<Character_*>_> evac_chars;
  Character *character;
  long *local_58;
  string local_50;
  
  lVar1 = **map_evacuate_void;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&evac_chars,"EvacuateStep",(allocator<char> *)&local_bc);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(lVar1 + 0x198),(key_type *)&evac_chars);
  iVar4 = util::variant::GetInt(pmVar6);
  lVar1 = **map_evacuate_void;
  std::__cxx11::string::string<std::allocator<char>>((string *)&character,"EvacuateTick",&local_be);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)(lVar1 + 0x198),(key_type *)&character);
  iVar5 = util::variant::GetInt(pmVar6);
  std::__cxx11::string::~string((string *)&character);
  std::__cxx11::string::~string((string *)&evac_chars);
  local_b8 = (long *)map_evacuate_void;
  if (*(int *)((long)map_evacuate_void + 8) < 1) {
    evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar1 = *map_evacuate_void;
    plVar9 = (long *)(lVar1 + 0x20);
    while (ppCVar3 = evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish, plVar9 = (long *)*plVar9,
          ppCVar8 = evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
                    .super__Vector_impl_data._M_start, plVar9 != (long *)(lVar1 + 0x20)) {
      character = (Character *)plVar9[2];
      iVar4 = (**(character->super_Command_Source)._vptr_Command_Source)();
      if ((char)iVar4 == '\0') {
        std::vector<Character_*,_std::allocator<Character_*>_>::push_back(&evac_chars,&character);
      }
    }
    for (; ppCVar8 != ppCVar3; ppCVar8 = ppCVar8 + 1) {
      World::Jail((*ppCVar8)->world,(Command_Source *)0x0,*ppCVar8,false);
    }
    *(undefined1 *)(*local_b8 + 200) = 0;
    operator_delete(local_b8,0x10);
    std::_Vector_base<Character_*,_std::allocator<Character_*>_>::~_Vector_base
              (&evac_chars.super__Vector_base<Character_*,_std::allocator<Character_*>_>);
  }
  else {
    local_ac = *(int *)((long)map_evacuate_void + 8) % (iVar4 / iVar5);
    plVar9 = (long *)(*map_evacuate_void + 0x20);
    local_b0 = iVar4 / iVar5;
    local_58 = plVar9;
    while (plVar7 = local_b8, plVar9 = (long *)*plVar9, plVar9 != local_58) {
      this = (Character *)plVar9[2];
      if (local_ac == 0) {
        pWVar2 = this->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&evac_chars,"map_evacuate",&local_be);
        iVar4 = *(int *)(plVar7 + 1) / local_b0;
        lVar1 = *(long *)*plVar7;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&character,"EvacuateStep",&local_bd);
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)(lVar1 + 0x198),(key_type *)&character);
        local_bc = util::variant::GetInt(pmVar6);
        local_bc = local_bc * iVar4;
        I18N::Format<int>(&local_50,&pWVar2->i18n,(key_type *)&evac_chars,&local_bc);
        (*(this->super_Command_Source)._vptr_Command_Source[5])(this,&local_50);
        plVar7 = local_b8;
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&character);
        std::__cxx11::string::~string((string *)&evac_chars);
      }
      lVar1 = *(long *)*plVar7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&evac_chars,"EvacuateSound",(allocator<char> *)&character);
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)(lVar1 + 0x198),(key_type *)&evac_chars);
      iVar4 = util::variant::GetInt(pmVar6);
      Character::PlaySound(this,(uchar)iVar4);
      std::__cxx11::string::~string((string *)&evac_chars);
    }
    *(int *)(local_b8 + 1) = *(int *)(local_b8 + 1) + -1;
  }
  return;
}

Assistant:

void map_evacuate(void *map_evacuate_void)
{
	map_evacuate_struct *evac(static_cast<map_evacuate_struct *>(map_evacuate_void));

	int ticks_per_step = int(evac->map->world->config["EvacuateStep"]) / int(evac->map->world->config["EvacuateTick"]);

	if (evac->step > 0)
	{
		bool step = evac->step % ticks_per_step == 0;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (step)
				character->ServerMsg(character->world->i18n.Format("map_evacuate", (evac->step / ticks_per_step) * int(evac->map->world->config["EvacuateStep"])));

			character->PlaySound(int(evac->map->world->config["EvacuateSound"]));
		}

		--evac->step;
	}
	else
	{
		std::vector<Character*> evac_chars;

		UTIL_FOREACH(evac->map->characters, character)
		{
			if (character->SourceAccess() < ADMIN_GUIDE)
			{
				evac_chars.push_back(character);
			}
		}

		UTIL_FOREACH(evac_chars, character)
		{
			character->world->Jail(0, character, false);
		}

		evac->map->evacuate_lock = false;
		delete evac;
	}
}